

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

ArchType parseBPFArch(StringRef ArchName)

{
  int iVar1;
  ArchType AVar2;
  size_t sVar3;
  char *__s2;
  char *__s1;
  size_t sStack_10;
  
  sVar3 = ArchName.Length;
  __s1 = ArchName.Data;
  if (sVar3 == 6) {
    iVar1 = bcmp(__s1,"bpf_be",6);
    if (iVar1 == 0) {
      return bpfeb;
    }
    __s2 = "bpf_le";
    sStack_10 = 6;
  }
  else if (sVar3 == 5) {
    iVar1 = bcmp(__s1,"bpfeb",5);
    if (iVar1 == 0) {
      return bpfeb;
    }
    __s2 = "bpfel";
    sStack_10 = 5;
  }
  else {
    if (sVar3 != 3) {
      return UnknownArch;
    }
    __s2 = "bpf";
    sStack_10 = 3;
  }
  iVar1 = bcmp(__s1,__s2,sStack_10);
  AVar2 = bpfel;
  if (iVar1 != 0) {
    AVar2 = UnknownArch;
  }
  return AVar2;
}

Assistant:

static Triple::ArchType parseBPFArch(StringRef ArchName) {
  if (ArchName.equals("bpf")) {
    if (sys::IsLittleEndianHost)
      return Triple::bpfel;
    else
      return Triple::bpfeb;
  } else if (ArchName.equals("bpf_be") || ArchName.equals("bpfeb")) {
    return Triple::bpfeb;
  } else if (ArchName.equals("bpf_le") || ArchName.equals("bpfel")) {
    return Triple::bpfel;
  } else {
    return Triple::UnknownArch;
  }
}